

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.cpp
# Opt level: O0

bool __thiscall ser::DataFieldInfo::operator==(DataFieldInfo *this,DataFieldInfo *other)

{
  __type _Var1;
  bool local_19;
  DataFieldInfo *other_local;
  DataFieldInfo *this_local;
  
  local_19 = false;
  if (((((this->bytesPerElement_ == other->bytesPerElement_) &&
        (local_19 = false, this->rank_ == other->rank_)) &&
       (local_19 = false, this->iSize_ == other->iSize_)) &&
      ((((local_19 = false, this->jSize_ == other->jSize_ &&
         (local_19 = false, this->kSize_ == other->kSize_)) &&
        ((local_19 = false, this->lSize_ == other->lSize_ &&
         ((local_19 = false, this->iMinusHalo_ == other->iMinusHalo_ &&
          (local_19 = false, this->iPlusHalo_ == other->iPlusHalo_)))))) &&
       (local_19 = false, this->jMinusHalo_ == other->jMinusHalo_)))) &&
     ((((local_19 = false, this->jPlusHalo_ == other->jPlusHalo_ &&
        (local_19 = false, this->kMinusHalo_ == other->kMinusHalo_)) &&
       (local_19 = false, this->kPlusHalo_ == other->kPlusHalo_)) &&
      ((local_19 = false, this->lMinusHalo_ == other->lMinusHalo_ &&
       (local_19 = false, this->lPlusHalo_ == other->lPlusHalo_)))))) {
    _Var1 = std::operator==(&this->name_,&other->name_);
    local_19 = false;
    if (_Var1) {
      _Var1 = std::operator==(&this->type_,&other->type_);
      local_19 = false;
      if (_Var1) {
        local_19 = MetainfoSet::operator==(&this->metainfo_,&other->metainfo_);
      }
    }
  }
  return local_19;
}

Assistant:

bool DataFieldInfo::operator==(const DataFieldInfo& other) const
{
    // Compare the least expensive elements first
    return (
            bytesPerElement_ == other.bytesPerElement_ &&
            rank_ == other.rank_ &&

            iSize_ == other.iSize_ &&
            jSize_ == other.jSize_ &&
            kSize_ == other.kSize_ &&
            lSize_ == other.lSize_ &&

            iMinusHalo_ == other.iMinusHalo_ &&
            iPlusHalo_  == other.iPlusHalo_ &&
            jMinusHalo_ == other.jMinusHalo_ &&
            jPlusHalo_  == other.jPlusHalo_ &&
            kMinusHalo_ == other.kMinusHalo_ &&
            kPlusHalo_  == other.kPlusHalo_ &&
            lMinusHalo_ == other.lMinusHalo_ &&
            lPlusHalo_  == other.lPlusHalo_ &&

            name_ == other.name_ &&
            type_ == other.type_ &&
            metainfo_ == other.metainfo_
        );
}